

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::RenderDeviceVkImpl::TestTextureFormat(RenderDeviceVkImpl *this,TEXTURE_FORMAT TexFormat)

{
  pointer pvVar1;
  VkPhysicalDevice pVVar2;
  SAMPLE_COUNT SVar3;
  TEXTURE_FORMAT TVar4;
  VkFormat VVar5;
  VkResult VVar6;
  ulong uVar7;
  undefined6 in_register_00000032;
  string msg;
  VkFormatProperties vkSrvFmtProps;
  _Alloc_hider local_68;
  size_type sStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  VkFormatProperties local_40;
  
  uVar7 = CONCAT62(in_register_00000032,TexFormat) & 0xffffffff;
  pvVar1 = (this->
           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_TextureFormatsInfo.
           super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar1[uVar7].super_TextureFormatInfo.Supported == false) {
    FormatString<char[32]>((string *)&local_68,(char (*) [32])"Texture format is not supported");
    DebugAssertionFailed
              (local_68._M_p,"TestTextureFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x1d7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
    }
  }
  pVVar2 = ((this->m_PhysicalDevice)._M_t.
            super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ._M_t.
            super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl)->
           m_VkDevice;
  pvVar1[uVar7].BindFlags = BIND_NONE;
  pvVar1[uVar7].Dimensions = RESOURCE_DIMENSION_SUPPORT_NONE;
  TVar4 = GetDefaultTextureViewFormat(TexFormat,TEXTURE_VIEW_SHADER_RESOURCE,8);
  if (TVar4 != TEX_FORMAT_UNKNOWN) {
    VVar5 = TexFormatToVkFormat(TVar4);
    local_40.bufferFeatures = 0;
    local_40.linearTilingFeatures = 0;
    local_40.optimalTilingFeatures = 0;
    (*vkGetPhysicalDeviceFormatProperties)(pVVar2,VVar5,&local_40);
    if ((local_40._0_8_ & 0x100000000) != 0) {
      pvVar1[uVar7].Filterable = (Bool)((byte)(local_40.optimalTilingFeatures >> 0xc) & 1);
      *(undefined1 *)&pvVar1[uVar7].BindFlags = (char)pvVar1[uVar7].BindFlags | BIND_SHADER_RESOURCE
      ;
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = 0;
      local_68._M_p = (Char *)0x0;
      sStack_60 = 0;
      VVar6 = (*vkGetPhysicalDeviceImageFormatProperties)
                        (pVVar2,VVar5,VK_IMAGE_TYPE_1D,VK_IMAGE_TILING_OPTIMAL,4,0,
                         (VkImageFormatProperties *)&local_68);
      if (VVar6 == VK_SUCCESS) {
        *(undefined1 *)&pvVar1[uVar7].Dimensions =
             (char)pvVar1[uVar7].Dimensions |
             (RESOURCE_DIMENSION_SUPPORT_TEX_1D_ARRAY|RESOURCE_DIMENSION_SUPPORT_TEX_1D);
      }
      VVar6 = (*vkGetPhysicalDeviceImageFormatProperties)
                        (pVVar2,VVar5,VK_IMAGE_TYPE_2D,VK_IMAGE_TILING_OPTIMAL,4,0,
                         (VkImageFormatProperties *)&local_68);
      if (VVar6 == VK_SUCCESS) {
        *(undefined1 *)&pvVar1[uVar7].Dimensions =
             (char)pvVar1[uVar7].Dimensions |
             (RESOURCE_DIMENSION_SUPPORT_TEX_2D_ARRAY|RESOURCE_DIMENSION_SUPPORT_TEX_2D);
      }
      VVar6 = (*vkGetPhysicalDeviceImageFormatProperties)
                        (pVVar2,VVar5,VK_IMAGE_TYPE_3D,VK_IMAGE_TILING_OPTIMAL,4,0,
                         (VkImageFormatProperties *)&local_68);
      if (VVar6 == VK_SUCCESS) {
        *(undefined1 *)&pvVar1[uVar7].Dimensions =
             (char)pvVar1[uVar7].Dimensions | RESOURCE_DIMENSION_SUPPORT_TEX_3D;
      }
      VVar6 = (*vkGetPhysicalDeviceImageFormatProperties)
                        (pVVar2,VVar5,VK_IMAGE_TYPE_2D,VK_IMAGE_TILING_OPTIMAL,4,0x10,
                         (VkImageFormatProperties *)&local_68);
      if (VVar6 == VK_SUCCESS) {
        pvVar1[uVar7].Dimensions =
             pvVar1[uVar7].Dimensions |
             (RESOURCE_DIMENSION_SUPPORT_TEX_CUBE_ARRAY|RESOURCE_DIMENSION_SUPPORT_TEX_CUBE);
      }
    }
  }
  TVar4 = GetDefaultTextureViewFormat(TexFormat,TEXTURE_VIEW_RENDER_TARGET,0x20);
  if (TVar4 != TEX_FORMAT_UNKNOWN) {
    VVar5 = TexFormatToVkFormat(TVar4);
    local_40.bufferFeatures = 0;
    local_40.linearTilingFeatures = 0;
    local_40.optimalTilingFeatures = 0;
    (*vkGetPhysicalDeviceFormatProperties)(pVVar2,VVar5,&local_40);
    if ((local_40._0_8_ & 0x8000000000) != 0) {
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = 0;
      local_68._M_p = (Char *)0x0;
      sStack_60 = 0;
      VVar6 = (*vkGetPhysicalDeviceImageFormatProperties)
                        (pVVar2,VVar5,VK_IMAGE_TYPE_2D,VK_IMAGE_TILING_OPTIMAL,0x80,0,
                         (VkImageFormatProperties *)&local_68);
      if (VVar6 == VK_SUCCESS) {
        *(undefined1 *)&pvVar1[uVar7].BindFlags = (char)pvVar1[uVar7].BindFlags | BIND_RENDER_TARGET
        ;
        SVar3 = VkSampleCountFlagsToSampleCount(local_58._M_allocated_capacity._4_4_);
        pvVar1[uVar7].SampleCounts = SVar3;
      }
    }
  }
  TVar4 = GetDefaultTextureViewFormat(TexFormat,TEXTURE_VIEW_DEPTH_STENCIL,0x40);
  if (TVar4 != TEX_FORMAT_UNKNOWN) {
    VVar5 = TexFormatToVkFormat(TVar4);
    local_40.bufferFeatures = 0;
    local_40.linearTilingFeatures = 0;
    local_40.optimalTilingFeatures = 0;
    (*vkGetPhysicalDeviceFormatProperties)(pVVar2,VVar5,&local_40);
    if ((local_40._0_8_ & 0x20000000000) != 0) {
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = 0;
      local_68._M_p = (Char *)0x0;
      sStack_60 = 0;
      VVar6 = (*vkGetPhysicalDeviceImageFormatProperties)
                        (pVVar2,VVar5,VK_IMAGE_TYPE_2D,VK_IMAGE_TILING_OPTIMAL,0x20,0,
                         (VkImageFormatProperties *)&local_68);
      if (VVar6 == VK_SUCCESS) {
        *(undefined1 *)&pvVar1[uVar7].BindFlags = (char)pvVar1[uVar7].BindFlags | BIND_DEPTH_STENCIL
        ;
        SVar3 = VkSampleCountFlagsToSampleCount(local_58._M_allocated_capacity._4_4_);
        pvVar1[uVar7].SampleCounts = SVar3;
      }
    }
  }
  TVar4 = GetDefaultTextureViewFormat(TexFormat,TEXTURE_VIEW_UNORDERED_ACCESS,0x40);
  if (TVar4 != TEX_FORMAT_UNKNOWN) {
    VVar5 = TexFormatToVkFormat(TVar4);
    local_40.bufferFeatures = 0;
    local_40.linearTilingFeatures = 0;
    local_40.optimalTilingFeatures = 0;
    (*vkGetPhysicalDeviceFormatProperties)(pVVar2,VVar5,&local_40);
    if ((local_40._0_8_ & 0x200000000) != 0) {
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = 0;
      local_68._M_p = (pointer)0x0;
      sStack_60 = 0;
      VVar6 = (*vkGetPhysicalDeviceImageFormatProperties)
                        (pVVar2,VVar5,VK_IMAGE_TYPE_2D,VK_IMAGE_TILING_OPTIMAL,8,0,
                         (VkImageFormatProperties *)&local_68);
      if (VVar6 == VK_SUCCESS) {
        *(undefined1 *)&pvVar1[uVar7].BindFlags =
             (char)pvVar1[uVar7].BindFlags | BIND_UNORDERED_ACCESS;
      }
    }
  }
  return;
}

Assistant:

void RenderDeviceVkImpl::TestTextureFormat(TEXTURE_FORMAT TexFormat)
{
    TextureFormatInfoExt& TexFormatInfo = m_TextureFormatsInfo[TexFormat];
    VERIFY(TexFormatInfo.Supported, "Texture format is not supported");

    VkPhysicalDevice vkPhysicalDevice = m_PhysicalDevice->GetVkDeviceHandle();

    auto CheckFormatProperties =
        [vkPhysicalDevice](VkFormat vkFmt, VkImageType vkImgType, VkImageUsageFlags vkUsage, VkImageFormatProperties& ImgFmtProps) //
    {
        VkResult err = vkGetPhysicalDeviceImageFormatProperties(vkPhysicalDevice, vkFmt, vkImgType, VK_IMAGE_TILING_OPTIMAL,
                                                                vkUsage, 0, &ImgFmtProps);
        return err == VK_SUCCESS;
    };


    TexFormatInfo.BindFlags  = BIND_NONE;
    TexFormatInfo.Dimensions = RESOURCE_DIMENSION_SUPPORT_NONE;

    {
        TEXTURE_FORMAT SRVFormat = GetDefaultTextureViewFormat(TexFormat, TEXTURE_VIEW_SHADER_RESOURCE, BIND_SHADER_RESOURCE);
        if (SRVFormat != TEX_FORMAT_UNKNOWN)
        {
            VkFormat           vkSrvFormat   = TexFormatToVkFormat(SRVFormat);
            VkFormatProperties vkSrvFmtProps = {};
            vkGetPhysicalDeviceFormatProperties(vkPhysicalDevice, vkSrvFormat, &vkSrvFmtProps);

            if (vkSrvFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT)
            {
                TexFormatInfo.Filterable = (vkSrvFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_SAMPLED_IMAGE_FILTER_LINEAR_BIT) != 0;
                TexFormatInfo.BindFlags |= BIND_SHADER_RESOURCE;

                VkImageFormatProperties ImgFmtProps = {};
                if (CheckFormatProperties(vkSrvFormat, VK_IMAGE_TYPE_1D, VK_IMAGE_USAGE_SAMPLED_BIT, ImgFmtProps))
                    TexFormatInfo.Dimensions |= RESOURCE_DIMENSION_SUPPORT_TEX_1D | RESOURCE_DIMENSION_SUPPORT_TEX_1D_ARRAY;

                if (CheckFormatProperties(vkSrvFormat, VK_IMAGE_TYPE_2D, VK_IMAGE_USAGE_SAMPLED_BIT, ImgFmtProps))
                    TexFormatInfo.Dimensions |= RESOURCE_DIMENSION_SUPPORT_TEX_2D | RESOURCE_DIMENSION_SUPPORT_TEX_2D_ARRAY;

                if (CheckFormatProperties(vkSrvFormat, VK_IMAGE_TYPE_3D, VK_IMAGE_USAGE_SAMPLED_BIT, ImgFmtProps))
                    TexFormatInfo.Dimensions |= RESOURCE_DIMENSION_SUPPORT_TEX_3D;

                {
                    VkResult err = vkGetPhysicalDeviceImageFormatProperties(vkPhysicalDevice, vkSrvFormat, VK_IMAGE_TYPE_2D, VK_IMAGE_TILING_OPTIMAL,
                                                                            VK_IMAGE_USAGE_SAMPLED_BIT, VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT, &ImgFmtProps);
                    if (err == VK_SUCCESS)
                        TexFormatInfo.Dimensions |= RESOURCE_DIMENSION_SUPPORT_TEX_CUBE | RESOURCE_DIMENSION_SUPPORT_TEX_CUBE_ARRAY;
                }
            }
        }
    }

    {
        TEXTURE_FORMAT RTVFormat = GetDefaultTextureViewFormat(TexFormat, TEXTURE_VIEW_RENDER_TARGET, BIND_RENDER_TARGET);
        if (RTVFormat != TEX_FORMAT_UNKNOWN)
        {
            VkFormat           vkRtvFormat   = TexFormatToVkFormat(RTVFormat);
            VkFormatProperties vkRtvFmtProps = {};
            vkGetPhysicalDeviceFormatProperties(vkPhysicalDevice, vkRtvFormat, &vkRtvFmtProps);

            if (vkRtvFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT)
            {
                VkImageFormatProperties ImgFmtProps = {};
                if (CheckFormatProperties(vkRtvFormat, VK_IMAGE_TYPE_2D, VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT, ImgFmtProps))
                {
                    TexFormatInfo.BindFlags |= BIND_RENDER_TARGET;
                    TexFormatInfo.SampleCounts = VkSampleCountFlagsToSampleCount(ImgFmtProps.sampleCounts);
                }
            }
        }
    }

    {
        TEXTURE_FORMAT DSVFormat = GetDefaultTextureViewFormat(TexFormat, TEXTURE_VIEW_DEPTH_STENCIL, BIND_DEPTH_STENCIL);
        if (DSVFormat != TEX_FORMAT_UNKNOWN)
        {
            VkFormat           vkDsvFormat   = TexFormatToVkFormat(DSVFormat);
            VkFormatProperties vkDsvFmtProps = {};
            vkGetPhysicalDeviceFormatProperties(vkPhysicalDevice, vkDsvFormat, &vkDsvFmtProps);
            if (vkDsvFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT)
            {
                VkImageFormatProperties ImgFmtProps = {};
                if (CheckFormatProperties(vkDsvFormat, VK_IMAGE_TYPE_2D, VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT, ImgFmtProps))
                {
                    // MoltenVK reports VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT for
                    // VK_FORMAT_D24_UNORM_S8_UINT even though the format is not supported.
                    TexFormatInfo.BindFlags |= BIND_DEPTH_STENCIL;
                    TexFormatInfo.SampleCounts = VkSampleCountFlagsToSampleCount(ImgFmtProps.sampleCounts);
                }
            }
        }
    }

    {
        TEXTURE_FORMAT UAVFormat = GetDefaultTextureViewFormat(TexFormat, TEXTURE_VIEW_UNORDERED_ACCESS, BIND_DEPTH_STENCIL);
        if (UAVFormat != TEX_FORMAT_UNKNOWN)
        {
            VkFormat           vkUavFormat   = TexFormatToVkFormat(UAVFormat);
            VkFormatProperties vkUavFmtProps = {};
            vkGetPhysicalDeviceFormatProperties(vkPhysicalDevice, vkUavFormat, &vkUavFmtProps);
            if (vkUavFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT)
            {
                VkImageFormatProperties ImgFmtProps = {};
                if (CheckFormatProperties(vkUavFormat, VK_IMAGE_TYPE_2D, VK_IMAGE_USAGE_STORAGE_BIT, ImgFmtProps))
                {
                    TexFormatInfo.BindFlags |= BIND_UNORDERED_ACCESS;
                }
            }
        }
    }
}